

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O0

void __thiscall amrex::StateData::allocOldData(StateData *this)

{
  bool bVar1;
  MFInfo *pMVar2;
  int *in_RDI;
  char *in_stack_ffffffffffffff68;
  MFInfo *in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffffa8;
  DistributionMapping *in_stack_ffffffffffffffb0;
  BoxArray *__args;
  FabFactory<amrex::FArrayBox> *__args_5;
  
  bVar1 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                          in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (bVar1) {
    StateDescriptor::nComp(*(StateDescriptor **)(in_RDI + 2));
    StateDescriptor::nExtra(*(StateDescriptor **)(in_RDI + 2));
    __args_5 = (FabFactory<amrex::FArrayBox> *)0x0;
    __args = (BoxArray *)0x0;
    MFInfo::MFInfo((MFInfo *)0x1115bc1);
    pMVar2 = MFInfo::SetTag(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    MFInfo::SetArena(pMVar2,*(Arena **)(in_RDI + 0x36));
    pMVar2 = (MFInfo *)
             std::
             unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          *)in_stack_ffffffffffffff70);
    std::
    make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int,int,amrex::MFInfo&,amrex::FabFactory<amrex::FArrayBox>&>
              (__args,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RDI,pMVar2,__args_5);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_ffffffffffffff70,
               (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)pMVar2);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_ffffffffffffff70);
    MFInfo::~MFInfo((MFInfo *)0x1115c65);
  }
  return;
}

Assistant:

void
StateData::allocOldData ()
{
    if (old_data == nullptr)
    {
        old_data = std::make_unique<MultiFab>(grids,dmap,desc->nComp(),desc->nExtra(),
                                              MFInfo().SetTag("StateData").SetArena(arena),
                                              *m_factory);
    }
}